

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::Interpreter
          (Interpreter *this,Allocator *alloc,ExtMap *ext_vars,uint max_stack,double gc_min_objects,
          double gc_growth_trigger,VmNativeCallbackMap *native_callbacks,
          JsonnetImportCallback *import_callback,void *import_callback_context)

{
  Identifier *pIVar1;
  Var *pVVar2;
  mapped_type *pmVar3;
  LocationRange *loc;
  Interpreter *this_00;
  AST *ast;
  string *filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  DesugaredObject *pDVar4;
  HeapObject *pHVar5;
  Allocator *in_RSI;
  Interpreter *in_RDI;
  JsonnetImportCallback *in_R9;
  Value VVar6;
  void *in_stack_00000008;
  HeapThunk *stdThunk;
  DesugaredObject *stdlib;
  uint in_stack_000028e4;
  AST *in_stack_000028e8;
  Interpreter *in_stack_000028f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
  *in_stack_fffffffffffff258;
  Stack *in_stack_fffffffffffff260;
  undefined8 in_stack_fffffffffffff268;
  Heap *in_stack_fffffffffffff270;
  Identifier **in_stack_fffffffffffff288;
  UString *in_stack_fffffffffffff290;
  allocator<char> *__a;
  Allocator *in_stack_fffffffffffff298;
  key_type *__k;
  Allocator *in_stack_fffffffffffff2a0;
  Allocator *alloc_00;
  allocator<char> *args_2;
  BuiltinMap *args;
  Interpreter *this_02;
  BindingFrame *up_values;
  BuiltinMap *self;
  HeapEntity *pHVar7;
  Stack *this_03;
  allocator<char> local_839;
  string local_838 [32];
  DesugaredObject *local_818;
  undefined1 local_809 [40];
  allocator<char> local_7e1;
  string local_7e0 [39];
  allocator<char> local_7b9;
  string local_7b8 [39];
  undefined1 local_791 [40];
  allocator<char> local_769;
  string local_768 [39];
  allocator<char> local_741;
  string local_740 [39];
  undefined1 local_719 [40];
  undefined1 local_6f1 [40];
  allocator<char> local_6c9;
  string local_6c8 [39];
  allocator<char> local_6a1;
  string local_6a0 [39];
  allocator<char> local_679;
  string local_678 [39];
  allocator<char> local_651;
  string local_650 [39];
  allocator<char> local_629;
  string local_628 [39];
  allocator<char> local_601;
  string local_600 [39];
  allocator<char> local_5d9;
  string local_5d8 [39];
  allocator<char> local_5b1;
  string local_5b0 [39];
  allocator<char> local_589;
  string local_588 [39];
  allocator<char> local_561;
  string local_560 [39];
  allocator<char> local_539;
  string local_538 [39];
  allocator<char> local_511;
  string local_510 [39];
  allocator<char> local_4e9;
  string local_4e8 [39];
  allocator<char> local_4c1;
  string local_4c0 [39];
  allocator<char> local_499;
  string local_498 [39];
  allocator<char> local_471;
  string local_470 [39];
  allocator<char> local_449;
  string local_448 [39];
  allocator<char> local_421;
  string local_420 [39];
  allocator<char> local_3f9;
  string local_3f8 [39];
  allocator<char> local_3d1;
  string local_3d0 [39];
  allocator<char> local_3a9;
  string local_3a8 [39];
  allocator<char> local_381;
  string local_380 [39];
  allocator<char> local_359;
  string local_358 [39];
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [32];
  Type local_1a8;
  undefined4 uStack_1a4;
  anon_union_8_3_4e909c26_for_v aStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  JsonnetImportCallback *local_40;
  Allocator *local_10;
  
  local_40 = in_R9;
  local_10 = in_RSI;
  Heap::Heap(in_stack_fffffffffffff270,(uint)((ulong)in_stack_fffffffffffff268 >> 0x20),
             (double)in_stack_fffffffffffff260);
  Stack::Stack(in_stack_fffffffffffff260,(uint)((ulong)in_stack_fffffffffffff258 >> 0x20));
  in_RDI->alloc = local_10;
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x21703c);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff2a0,(char32_t *)in_stack_fffffffffffff298,
             (allocator<char32_t> *)in_stack_fffffffffffff290);
  pIVar1 = Allocator::makeIdentifier(in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff260);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x217093);
  in_RDI->idImport = pIVar1;
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2170e1);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff2a0,(char32_t *)in_stack_fffffffffffff298,
             (allocator<char32_t> *)in_stack_fffffffffffff290);
  pIVar1 = Allocator::makeIdentifier(in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff260);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x217138);
  in_RDI->idArrayElement = pIVar1;
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x217186);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff2a0,(char32_t *)in_stack_fffffffffffff298,
             (allocator<char32_t> *)in_stack_fffffffffffff290);
  pIVar1 = Allocator::makeIdentifier(in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff260);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2171dd);
  in_RDI->idInvariant = pIVar1;
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x21722b);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff2a0,(char32_t *)in_stack_fffffffffffff298,
             (allocator<char32_t> *)in_stack_fffffffffffff290);
  pIVar1 = Allocator::makeIdentifier(in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff260);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x217282);
  in_RDI->idInternal = pIVar1;
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2172d0);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff2a0,(char32_t *)in_stack_fffffffffffff298,
             (allocator<char32_t> *)in_stack_fffffffffffff290);
  pIVar1 = Allocator::makeIdentifier(in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff260);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x217327);
  in_RDI->idJsonObjVar = pIVar1;
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x217375);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff2a0,(char32_t *)in_stack_fffffffffffff298,
             (allocator<char32_t> *)in_stack_fffffffffffff290);
  pIVar1 = Allocator::makeIdentifier(in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff260);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2173cc);
  in_RDI->idEmpty = pIVar1;
  LocationRange::LocationRange((LocationRange *)in_stack_fffffffffffff270);
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x217440);
  pVVar2 = Allocator::
           make<jsonnet::internal::Var,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,jsonnet::internal::Identifier_const*&>
                     (in_stack_fffffffffffff2a0,(LocationRange *)in_stack_fffffffffffff298,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff290,in_stack_fffffffffffff288);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)in_stack_fffffffffffff270);
  LocationRange::~LocationRange((LocationRange *)0x217490);
  in_RDI->jsonObjVar = &pVVar2->super_AST;
  std::
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
  ::map((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
         *)0x2174bf);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
         *)in_stack_fffffffffffff260,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
         *)in_stack_fffffffffffff258);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
         *)in_stack_fffffffffffff260,in_stack_fffffffffffff258);
  in_RDI->importCallback = local_40;
  in_RDI->importCallbackContext = in_stack_00000008;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
         *)0x217545);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         *)0x217561);
  std::
  vector<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ::vector((vector<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
            *)0x21757d);
  VVar6 = makeNull(in_RDI);
  aStack_1a0 = VVar6.v;
  local_1a8 = VVar6.t;
  *(ulong *)&in_RDI->scratch = CONCAT44(uStack_1a4,local_1a8);
  (in_RDI->scratch).v = aStack_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinMakeArray;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinPow;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinFloor;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinCeil;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinSqrt;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinSin;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinCos;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinTan;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinAsin;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinAcos;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinAtan;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinType;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator(&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinFilter;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinObjectHasEx;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinLength;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinObjectFieldsEx;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator(&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinCodepoint;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator(&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinChar;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator(&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinLog;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinExp;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinMantissa;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinExponent;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator(&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinModulo;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator(&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinExtVar;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator(&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinPrimitiveEquals;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator(&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinNative;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinMd5;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinTrace;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinSplitLimit;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator(&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinSubstr;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator(&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinRange;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator(&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinStrReplace;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  this_03 = (Stack *)&in_RDI->builtins;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  loc = (LocationRange *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                      *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *(code **)&loc->file = builtinAsciiLower;
  (loc->file)._M_string_length = 0;
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  self = &in_RDI->builtins;
  pHVar7 = (HeapEntity *)local_6f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  this_00 = (Interpreter *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                          *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *(code **)&this_00->heap = builtinAsciiUpper;
  (this_00->heap).gcTuneGrowthTrigger = 0.0;
  std::__cxx11::string::~string((string *)(local_6f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_6f1);
  up_values = (BindingFrame *)local_719;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinJoin;
  pmVar3[1] = 0;
  std::__cxx11::string::~string((string *)(local_719 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinParseJson;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator(&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *pmVar3 = (mapped_type)builtinParseYaml;
  pmVar3[1] = 0;
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator(&local_769);
  args = &in_RDI->builtins;
  this_02 = (Interpreter *)local_791;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  ast = (AST *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                             *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  ast->_vptr_AST = (_func_int **)builtinEncodeUTF8;
  *(undefined8 *)&(ast->location).file = 0;
  std::__cxx11::string::~string((string *)(local_791 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_791);
  alloc_00 = (Allocator *)&in_RDI->builtins;
  args_2 = &local_7b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  filename = (string *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                           *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *(code **)filename = builtinDecodeUTF8;
  filename->_M_string_length = 0;
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,(char *)in_stack_fffffffffffff298,
             (allocator<char> *)in_stack_fffffffffffff290);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                          *)in_stack_fffffffffffff2a0,(key_type *)in_stack_fffffffffffff298);
  *(code **)this_01 = builtinAtan2;
  this_01->_M_string_length = 0;
  std::__cxx11::string::~string(local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  __a = (allocator<char> *)&in_RDI->builtins;
  __k = (key_type *)local_809;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__k,__a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
                         *)this_01,__k);
  *pmVar3 = (mapped_type)builtinHypot;
  pmVar3[1] = 0;
  std::__cxx11::string::~string((string *)(local_809 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__k,__a);
  pDVar4 = makeStdlibAST(alloc_00,filename);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator(&local_839);
  local_818 = pDVar4;
  jsonnet_static_analysis(ast);
  in_RDI->stdlibAST = local_818;
  (anonymous_namespace)::Interpreter::
  makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,decltype(nullptr),decltype(nullptr),int,jsonnet::internal::AST_const*>
            (this_02,(void **)args,&ast->_vptr_AST,(int *)args_2,(AST **)alloc_00);
  Stack::newCall(this_03,loc,pHVar7,(HeapObject *)self,(uint)((ulong)this_00 >> 0x20),up_values);
  evaluate(in_stack_000028f0,in_stack_000028e8,in_stack_000028e4);
  pHVar7 = (in_RDI->scratch).v.h;
  if (pHVar7 == (HeapEntity *)0x0) {
    pHVar5 = (HeapObject *)0x0;
  }
  else {
    pHVar5 = (HeapObject *)
             __dynamic_cast(pHVar7,&(anonymous_namespace)::HeapEntity::typeinfo,
                            &(anonymous_namespace)::HeapObject::typeinfo,0);
  }
  in_RDI->stdObject = pHVar5;
  prepareSourceValThunks(this_00);
  return;
}

Assistant:

Interpreter(Allocator *alloc, const ExtMap &ext_vars, unsigned max_stack, double gc_min_objects,
                double gc_growth_trigger, const VmNativeCallbackMap &native_callbacks,
                JsonnetImportCallback *import_callback, void *import_callback_context)

        : heap(gc_min_objects, gc_growth_trigger),
          stack(max_stack),
          alloc(alloc),
          idImport(alloc->makeIdentifier(U"import")),
          idArrayElement(alloc->makeIdentifier(U"array_element")),
          idInvariant(alloc->makeIdentifier(U"object_assert")),
          idInternal(alloc->makeIdentifier(U"__internal__")),
          idJsonObjVar(alloc->makeIdentifier(U"_")),
          idEmpty(alloc->makeIdentifier(U"")),
          jsonObjVar(alloc->make<Var>(LocationRange(), Fodder{}, idJsonObjVar)),
          externalVars(ext_vars),
          nativeCallbacks(native_callbacks),
          importCallback(import_callback),
          importCallbackContext(import_callback_context)
    {
        scratch = makeNull();
        builtins["makeArray"] = &Interpreter::builtinMakeArray;
        builtins["pow"] = &Interpreter::builtinPow;
        builtins["floor"] = &Interpreter::builtinFloor;
        builtins["ceil"] = &Interpreter::builtinCeil;
        builtins["sqrt"] = &Interpreter::builtinSqrt;
        builtins["sin"] = &Interpreter::builtinSin;
        builtins["cos"] = &Interpreter::builtinCos;
        builtins["tan"] = &Interpreter::builtinTan;
        builtins["asin"] = &Interpreter::builtinAsin;
        builtins["acos"] = &Interpreter::builtinAcos;
        builtins["atan"] = &Interpreter::builtinAtan;
        builtins["type"] = &Interpreter::builtinType;
        builtins["filter"] = &Interpreter::builtinFilter;
        builtins["objectHasEx"] = &Interpreter::builtinObjectHasEx;
        builtins["length"] = &Interpreter::builtinLength;
        builtins["objectFieldsEx"] = &Interpreter::builtinObjectFieldsEx;
        builtins["codepoint"] = &Interpreter::builtinCodepoint;
        builtins["char"] = &Interpreter::builtinChar;
        builtins["log"] = &Interpreter::builtinLog;
        builtins["exp"] = &Interpreter::builtinExp;
        builtins["mantissa"] = &Interpreter::builtinMantissa;
        builtins["exponent"] = &Interpreter::builtinExponent;
        builtins["modulo"] = &Interpreter::builtinModulo;
        builtins["extVar"] = &Interpreter::builtinExtVar;
        builtins["primitiveEquals"] = &Interpreter::builtinPrimitiveEquals;
        builtins["native"] = &Interpreter::builtinNative;
        builtins["md5"] = &Interpreter::builtinMd5;
        builtins["trace"] = &Interpreter::builtinTrace;
        builtins["splitLimit"] = &Interpreter::builtinSplitLimit;
        builtins["substr"] = &Interpreter::builtinSubstr;
        builtins["range"] = &Interpreter::builtinRange;
        builtins["strReplace"] = &Interpreter::builtinStrReplace;
        builtins["asciiLower"] = &Interpreter::builtinAsciiLower;
        builtins["asciiUpper"] = &Interpreter::builtinAsciiUpper;
        builtins["join"] = &Interpreter::builtinJoin;
        builtins["parseJson"] = &Interpreter::builtinParseJson;
        builtins["parseYaml"] = &Interpreter::builtinParseYaml;
        builtins["encodeUTF8"] = &Interpreter::builtinEncodeUTF8;
        builtins["decodeUTF8"] = &Interpreter::builtinDecodeUTF8;
        builtins["atan2"] = &Interpreter::builtinAtan2;
        builtins["hypot"] = &Interpreter::builtinHypot;

        DesugaredObject *stdlib = makeStdlibAST(alloc, "__internal__");
        jsonnet_static_analysis(stdlib);
        stdlibAST = stdlib; // stdlibAST is const, so we need to do analysis before this assignment
        auto stdThunk = makeHeap<HeapThunk>(nullptr, nullptr, 0, static_cast<const AST*>(stdlibAST));
        stack.newCall(stdThunk->body->location, stdThunk, stdThunk->self, stdThunk->offset, stdThunk->upValues);
        evaluate(stdThunk->body, 0);
        stdObject = dynamic_cast<HeapObject*>(scratch.v.h);
        prepareSourceValThunks();
    }